

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex.c
# Opt level: O0

void hexUpper(char *hex)

{
  octet o;
  char *in_RDI;
  char *local_8;
  
  for (local_8 = in_RDI; *local_8 != '\0'; local_8 = local_8 + 2) {
    o = hexToO(local_8);
    hexFromOUpper(local_8,o);
  }
  return;
}

Assistant:

void hexUpper(char* hex)
{
	ASSERT(hexIsValid(hex));
	for (; *hex; hex += 2)
		hexFromOUpper(hex, hexToO(hex));
}